

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmJsonObjects.cxx
# Opt level: O2

Value * cmDumpCodeModel(Value *__return_storage_ptr__,cmake *cm)

{
  cmGlobalGenerator *pcVar1;
  cmMakefile *this;
  _Base_ptr p_Var2;
  long *plVar3;
  pointer ppcVar4;
  bool bVar5;
  Value *pVVar6;
  const_reference ppcVar7;
  char *value;
  string *psVar8;
  long lVar9;
  _Rb_tree_node_base *p_Var10;
  cmake *cm_00;
  pointer ppcVar11;
  _Base_ptr p_Var12;
  cmLocalGenerator **lgIt;
  long *plVar13;
  pointer value_00;
  vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_> targetList;
  Value pObj;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_200;
  Value local_1e8;
  Value local_1c0;
  Value local_198;
  Value local_170;
  Value local_148;
  Value local_120;
  Value local_f8;
  Value local_d0;
  Value local_a8;
  Value local_80;
  Value local_58;
  
  Json::Value::Value(__return_storage_ptr__,objectValue);
  Json::Value::Value(&local_1e8,arrayValue);
  (anonymous_namespace)::getConfigurations_abi_cxx11_(&local_200,(_anonymous_namespace_ *)cm,cm_00);
  value_00 = local_200.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (value_00 ==
        local_200.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_200);
      pVVar6 = Json::Value::operator[](__return_storage_ptr__,&kCONFIGURATIONS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_1e8);
      Json::Value::~Value(&local_1e8);
      return __return_storage_ptr__;
    }
    Json::Value::Value(&local_198,objectValue);
    Json::Value::Value(&local_148,value_00);
    pVVar6 = Json::Value::operator[](&local_198,&kNAME_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar6,&local_148);
    Json::Value::~Value(&local_148);
    Json::Value::Value(&local_170,arrayValue);
    pcVar1 = cm->GlobalGenerator;
    p_Var10 = (pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    while( true ) {
      if ((_Rb_tree_header *)p_Var10 == &(pcVar1->ProjectMap)._M_t._M_impl.super__Rb_tree_header)
      break;
      Json::Value::Value(&pObj,objectValue);
      Json::Value::Value(&local_a8,(string *)(p_Var10 + 1));
      pVVar6 = Json::Value::operator[](&pObj,&kNAME_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_a8);
      Json::Value::~Value(&local_a8);
      if (*(_Base_ptr *)(p_Var10 + 2) == p_Var10[2]._M_parent) {
        __assert_fail("!projectIt.second.empty()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/cmJsonObjects.cxx"
                      ,0x276,"Json::Value DumpProjectList(const cmake *, const std::string &)");
      }
      ppcVar7 = std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::at
                          ((vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_> *)
                           (p_Var10 + 2),0);
      this = (*ppcVar7)->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_80,"CMAKE_MINIMUM_REQUIRED_VERSION",(allocator<char> *)&targetList
                );
      value = cmMakefile::GetDefinition(this,(string *)&local_80);
      std::__cxx11::string::~string((string *)&local_80);
      if (value == (char *)0x0) {
        value = "";
      }
      Json::Value::Value(&local_58,value);
      pVVar6 = Json::Value::operator[](&pObj,&kMINIMUM_CMAKE_VERSION_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_58);
      Json::Value::~Value(&local_58);
      psVar8 = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(this);
      Json::Value::Value(&local_d0,psVar8);
      pVVar6 = Json::Value::operator[](&pObj,&kSOURCE_DIRECTORY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_d0);
      Json::Value::~Value(&local_d0);
      psVar8 = cmMakefile::GetCurrentBinaryDirectory_abi_cxx11_(this);
      Json::Value::Value(&local_f8,psVar8);
      pVVar6 = Json::Value::operator[](&pObj,&kBUILD_DIRECTORY_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_f8);
      Json::Value::~Value(&local_f8);
      Json::Value::Value(&local_1c0,arrayValue);
      targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      targetList.super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      p_Var2 = p_Var10[2]._M_parent;
      for (p_Var12 = *(_Base_ptr *)(p_Var10 + 2); p_Var12 != p_Var2;
          p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
        std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>::
        insert<__gnu_cxx::__normal_iterator<cmGeneratorTarget*const*,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,void>
                  ((vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>> *)&targetList,
                   (const_iterator)
                   targetList.
                   super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
                   (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    )*(cmGeneratorTarget ***)(*(long *)p_Var12 + 0x100),
                   (__normal_iterator<cmGeneratorTarget_*const_*,_std::vector<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>_>
                    )*(cmGeneratorTarget ***)(*(long *)p_Var12 + 0x108));
      }
      std::
      __sort<__gnu_cxx::__normal_iterator<cmGeneratorTarget**,std::vector<cmGeneratorTarget*,std::allocator<cmGeneratorTarget*>>>,__gnu_cxx::__ops::_Iter_less_iter>
                (targetList.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_start,
                 targetList.
                 super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                 _M_impl.super__Vector_impl_data._M_finish);
      ppcVar4 = targetList.
                super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      for (ppcVar11 = targetList.
                      super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; ppcVar11 != ppcVar4;
          ppcVar11 = ppcVar11 + 1) {
        DumpTarget(&local_80,*ppcVar11,value_00);
        bVar5 = Json::Value::isNull(&local_80);
        if (!bVar5) {
          Json::Value::append(&local_1c0,&local_80);
        }
        Json::Value::~Value(&local_80);
      }
      std::_Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>::~_Vector_base
                (&targetList.
                  super__Vector_base<cmGeneratorTarget_*,_std::allocator<cmGeneratorTarget_*>_>);
      pVVar6 = Json::Value::operator[](&pObj,&kTARGETS_KEY_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_1c0);
      Json::Value::~Value(&local_1c0);
      p_Var2 = p_Var10[2]._M_parent;
      for (p_Var12 = *(_Base_ptr *)(p_Var10 + 2); p_Var12 != p_Var2;
          p_Var12 = (_Base_ptr)&p_Var12->_M_parent) {
        plVar13 = *(long **)(*(long *)(*(long *)p_Var12 + 0x28) + 0x200);
        plVar3 = *(long **)(*(long *)(*(long *)p_Var12 + 0x28) + 0x208);
        while (plVar13 != plVar3) {
          if (*plVar13 == 0) goto LAB_00145e18;
          lVar9 = __dynamic_cast(*plVar13,&cmInstallGenerator::typeinfo,
                                 &cmInstallSubdirectoryGenerator::typeinfo,0);
          plVar13 = plVar13 + 1;
          if (lVar9 == 0) goto LAB_00145e18;
        }
      }
LAB_00145e18:
      Json::Value::Value(&local_120,p_Var12 != p_Var2);
      pVVar6 = Json::Value::operator[](&pObj,&kHAS_INSTALL_RULE_abi_cxx11_);
      Json::Value::operator=(pVVar6,&local_120);
      Json::Value::~Value(&local_120);
      Json::Value::append(&local_170,&pObj);
      Json::Value::~Value(&pObj);
      p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
    }
    pVVar6 = Json::Value::operator[](&local_198,&kPROJECTS_KEY_abi_cxx11_);
    Json::Value::operator=(pVVar6,&local_170);
    Json::Value::~Value(&local_170);
    Json::Value::append(&local_1e8,&local_198);
    Json::Value::~Value(&local_198);
    value_00 = value_00 + 1;
  } while( true );
}

Assistant:

Json::Value cmDumpCodeModel(const cmake* cm)
{
  Json::Value result = Json::objectValue;
  result[kCONFIGURATIONS_KEY] = DumpConfigurationsList(cm);
  return result;
}